

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

void __thiscall ON_Layer::DeletePerViewportPlotColor(ON_Layer *this,ON_UUID *viewport_id)

{
  bool bVar1;
  uint uVar2;
  ON__LayerPerViewSettings *pOVar3;
  undefined1 in_R9B;
  ON_UUID viewport_id_00;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_44;
  _func_int **local_40;
  ON_UserData *local_38;
  ON__LayerPerViewSettings *local_30;
  ON__LayerPerViewSettings *vp_settings;
  ON__LayerExtensions *pOStack_20;
  int i;
  ON__LayerExtensions *ud;
  ON_UUID *viewport_id_local;
  ON_Layer *this_local;
  
  ud = (ON__LayerExtensions *)viewport_id;
  viewport_id_local = (ON_UUID *)this;
  bVar1 = ON_UuidIsNil(viewport_id);
  if (bVar1) {
    pOStack_20 = ON__LayerExtensions::LayerExtensions(this,&this->m_extension_bits,false);
    if (pOStack_20 != (ON__LayerExtensions *)0x0) {
      vp_settings._4_4_ =
           ON_SimpleArray<ON__LayerPerViewSettings>::Count(&pOStack_20->m_vp_settings);
      while (vp_settings._4_4_ != 0) {
        vp_settings._4_4_ = vp_settings._4_4_ + -1;
        ON_Color::ON_Color((ON_Color *)&vp_settings,0xffffffff);
        pOVar3 = ON_SimpleArray<ON__LayerPerViewSettings>::operator[]
                           (&pOStack_20->m_vp_settings,vp_settings._4_4_);
        (pOVar3->m_plot_color).field_0 = vp_settings._0_4_;
        pOVar3 = ON_SimpleArray<ON__LayerPerViewSettings>::operator[]
                           (&pOStack_20->m_vp_settings,vp_settings._4_4_);
        uVar2 = ON__LayerPerViewSettings::SettingsMask(pOVar3);
        if (uVar2 == 0) {
          ON_SimpleArray<ON__LayerPerViewSettings>::Remove
                    (&pOStack_20->m_vp_settings,vp_settings._4_4_);
        }
      }
      vp_settings._4_4_ = vp_settings._4_4_ + -1;
      bVar1 = ON__LayerExtensions::IsEmpty(pOStack_20);
      if (bVar1) {
        ON__LayerExtensions::DeleteViewportSettings
                  (this,&this->m_extension_bits,(ON__LayerPerViewSettings *)0x0);
      }
    }
  }
  else {
    local_40 = (ud->super_ON_UserData).super_ON_Object._vptr_ON_Object;
    local_38 = (ud->super_ON_UserData).super_ON_Object.m_userdata_list;
    viewport_id_00.Data4[0] = '\0';
    viewport_id_00.Data4[1] = '\0';
    viewport_id_00.Data4[2] = '\0';
    viewport_id_00.Data4[3] = '\0';
    viewport_id_00.Data4[4] = '\0';
    viewport_id_00.Data4[5] = '\0';
    viewport_id_00.Data4[6] = '\0';
    viewport_id_00.Data4[7] = '\0';
    viewport_id_00._0_8_ = local_38;
    local_30 = ON__LayerExtensions::ViewportSettings
                         ((ON__LayerExtensions *)this,(ON_Layer *)&this->m_extension_bits,
                          (uchar *)local_40,viewport_id_00,(bool)in_R9B);
    if (local_30 != (ON__LayerPerViewSettings *)0x0) {
      ON_Color::ON_Color((ON_Color *)&local_44,0xffffffff);
      (local_30->m_plot_color).field_0 = local_44;
      uVar2 = ON__LayerPerViewSettings::SettingsMask(local_30);
      if (uVar2 == 0) {
        ON__LayerExtensions::DeleteViewportSettings(this,&this->m_extension_bits,local_30);
      }
    }
  }
  return;
}

Assistant:

void ON_Layer::DeletePerViewportPlotColor( const ON_UUID& viewport_id )
{
  if ( ON_UuidIsNil(viewport_id) )
  {
    ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(*this,&m_extension_bits,false);
    if ( 0 != ud )
    {
      for ( int i = ud->m_vp_settings.Count(); i--; /*empty iterator*/ )
      {
        ud->m_vp_settings[i].m_plot_color = ON_UNSET_COLOR;
        if ( 0 == ud->m_vp_settings[i].SettingsMask() )
          ud->m_vp_settings.Remove(i);
      }
      if ( ud->IsEmpty() )
      {
        ON__LayerExtensions::DeleteViewportSettings( *this, &m_extension_bits, 0 );
        ud = 0;
      }
    }
  }
  else
  {
    ON__LayerPerViewSettings* vp_settings = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, false );
    if (vp_settings) 
    {
      vp_settings->m_plot_color = ON_UNSET_COLOR;
      if ( 0 == vp_settings->SettingsMask() )
        ON__LayerExtensions::DeleteViewportSettings(*this,&m_extension_bits,vp_settings);
    }
  }
}